

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers-inl.h
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spdlog::cfg::helpers::extract_kv_
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,char sep,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined7 in_register_00000031;
  string v;
  string k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar3 = ::std::__cxx11::string::find((char)str,CONCAT71(in_register_00000031,sep));
  paVar1 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (lVar3 == -1) {
    ::std::__cxx11::string::_M_assign((string *)&local_90);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  lVar3 = ::std::__cxx11::string::find_last_not_of((char *)&local_70,0x13e90d,0xffffffffffffffff);
  uVar4 = lVar3 + 1;
  if (uVar4 <= local_70._M_string_length) {
    local_70._M_dataplus._M_p[uVar4] = '\0';
    local_70._M_string_length = uVar4;
    ::std::__cxx11::string::find_first_not_of((char *)&local_70,0x13e90d,0);
    ::std::__cxx11::string::erase((ulong)&local_70,0);
    lVar3 = ::std::__cxx11::string::find_last_not_of((char *)&local_90,0x13e90d,0xffffffffffffffff);
    uVar4 = lVar3 + 1;
    if (uVar4 <= local_90._M_string_length) {
      local_90._M_dataplus._M_p[uVar4] = '\0';
      local_90._M_string_length = uVar4;
      ::std::__cxx11::string::find_first_not_of((char *)&local_90,0x13e90d,0);
      ::std::__cxx11::string::erase((ulong)&local_90,0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (__return_storage_ptr__,&local_70,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  }
  uVar5 = ::std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     uVar4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

inline std::pair<std::string, std::string> extract_kv_(char sep, const std::string &str) {
    auto n = str.find(sep);
    std::string k, v;
    if (n == std::string::npos) {
        v = str;
    } else {
        k = str.substr(0, n);
        v = str.substr(n + 1);
    }
    return std::make_pair(trim_(k), trim_(v));
}